

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

size_t readstr<std::shared_ptr<ReadWriter>>(shared_ptr<ReadWriter> *rd,string *v,size_t n)

{
  element_type *peVar1;
  
  std::__cxx11::string::resize((ulong)v);
  peVar1 = (rd->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar1->_vptr_ReadWriter[2])(peVar1,(v->_M_dataplus)._M_p,n);
  std::__cxx11::string::resize((ulong)v);
  stringlength<char>((v->_M_dataplus)._M_p);
  std::__cxx11::string::resize((ulong)v);
  return v->_M_string_length;
}

Assistant:

size_t readstr(PTR rd, std::string& v, size_t n)
{
    v.resize(n);
    size_t nr= rd->read((uint8_t*)&v[0], n);
    v.resize(nr);
    v.resize(stringlength(&v[0]));
    return v.size();
}